

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void SimpleVFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  longlong lVar1;
  longlong lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __m128i *q1_00;
  int in_ESI;
  undefined8 *in_RDI;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i *in_stack_ffffffffffffffc8;
  __m128i *in_stack_ffffffffffffffd0;
  
  q1_00 = (__m128i *)((long)in_RDI + (long)-in_ESI);
  lVar1 = (*q1_00)[0];
  lVar2 = (*q1_00)[1];
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  DoFilter2_SSE2(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (__m128i *)((long)in_RDI + (long)(in_ESI * -2)),q1_00,(int)((ulong)in_RDI >> 0x20))
  ;
  *(longlong *)((long)in_RDI + (long)-in_ESI) = lVar1;
  ((longlong *)((long)in_RDI + (long)-in_ESI))[1] = lVar2;
  *in_RDI = uVar3;
  in_RDI[1] = uVar4;
  return;
}

Assistant:

static void SimpleVFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  // Load
  __m128i p1 = _mm_loadu_si128((__m128i*)&p[-2 * stride]);
  __m128i p0 = _mm_loadu_si128((__m128i*)&p[-stride]);
  __m128i q0 = _mm_loadu_si128((__m128i*)&p[0]);
  __m128i q1 = _mm_loadu_si128((__m128i*)&p[stride]);

  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-stride], p0);
  _mm_storeu_si128((__m128i*)&p[0], q0);
}